

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall Preprocessor::substituteUntilNewline(Preprocessor *this,Symbols *substituted)

{
  qsizetype *index;
  long lVar1;
  Symbol *pSVar2;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *this_00;
  bool bVar3;
  long lVar4;
  long lVar5;
  Token TVar6;
  long in_FS_OFFSET;
  Bucket BVar7;
  Symbol definedOrNotDefined;
  SubArray local_90;
  Symbol local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->super_Parser).symbols.d.size;
  lVar5 = (this->super_Parser).index;
  if (lVar5 < lVar4) {
    index = &(this->super_Parser).index;
    do {
      lVar1 = lVar5 + 1;
      (this->super_Parser).index = lVar1;
      TVar6 = (this->super_Parser).symbols.d.ptr[lVar5].token;
      if (TVar6 == IDENTIFIER) {
        local_68.lineNum = 0;
        local_68.token = NOTOKEN;
        macroExpand(substituted,this,(Symbols *)this,index,
                    (this->super_Parser).symbols.d.ptr[lVar5].lineNum,true,
                    (QSet<QByteArray> *)&local_68);
        QHash<QByteArray,_QHashDummyValue>::~QHash((QHash<QByteArray,_QHashDummyValue> *)&local_68);
      }
      else if (TVar6 == PP_DEFINED) {
        if ((lVar1 < lVar4) && ((this->super_Parser).symbols.d.ptr[lVar1].token == LPAREN)) {
          *index = lVar5 + 2;
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
        lVar5 = *index;
        if ((lVar4 <= lVar5) ||
           (pSVar2 = (this->super_Parser).symbols.d.ptr, pSVar2[lVar5].token != IDENTIFIER)) {
          Parser::error(&this->super_Parser,(char *)0x0);
        }
        *index = lVar5 + 1;
        local_68.lineNum = pSVar2[lVar5].lineNum;
        local_68.token = pSVar2[lVar5].token;
        local_90.array.d.d = pSVar2[lVar5].lex.d.d;
        local_90.array.d.ptr = pSVar2[lVar5].lex.d.ptr;
        local_90.array.d.size = pSVar2[lVar5].lex.d.size;
        if (&(local_90.array.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_90.array.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_90.array.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_90.from = pSVar2[lVar5].from;
        local_90.len = pSVar2[lVar5].len;
        if (&(local_90.array.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_90.array.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_90.array.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        this_00 = (this->macros).d;
        TVar6 = PP_MOC_FALSE;
        local_68.lex.d.d = local_90.array.d.d;
        local_68.lex.d.ptr = local_90.array.d.ptr;
        local_68.lex.d.size = local_90.array.d.size;
        local_68.from = local_90.from;
        local_68.len = local_90.len;
        if (this_00 != (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) {
          BVar7 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
                            (this_00,&local_90);
          if ((BVar7.span)->offsets[BVar7.index] != 0xff) {
            TVar6 = ((BVar7.span)->entries == (Entry *)0x0) + PP_MOC_TRUE;
          }
        }
        local_68.token = TVar6;
        if (&(local_90.array.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_90.array.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_90.array.d.d)->super_QArrayData,1,0x10);
          }
        }
        QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                  ((QMovableArrayOps<Symbol> *)substituted,(substituted->d).size,&local_68);
        QList<Symbol>::end(substituted);
        if (((bVar3) &&
            (lVar4 = (this->super_Parser).index, lVar4 < (this->super_Parser).symbols.d.size)) &&
           ((this->super_Parser).symbols.d.ptr[lVar4].token == PP_RPAREN)) {
          *index = lVar4 + 1;
        }
        if (&(local_68.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_68.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_68.lex.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        if (TVar6 == NEWLINE) {
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                    ((QMovableArrayOps<Symbol> *)substituted,(substituted->d).size,
                     (this->super_Parser).symbols.d.ptr + lVar5);
          QList<Symbol>::end(substituted);
          break;
        }
        QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                  ((QMovableArrayOps<Symbol> *)substituted,(substituted->d).size,
                   (this->super_Parser).symbols.d.ptr + lVar5);
        QList<Symbol>::end(substituted);
      }
      lVar4 = (this->super_Parser).symbols.d.size;
      lVar5 = (this->super_Parser).index;
    } while (lVar5 < lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Preprocessor::substituteUntilNewline(Symbols &substituted)
{
    while (hasNext()) {
        Token token = next();
        if (token == PP_IDENTIFIER) {
            macroExpand(&substituted, this, symbols, index, symbol().lineNum, true);
        } else if (token == PP_DEFINED) {
            bool braces = test(PP_LPAREN);
            next(PP_IDENTIFIER);
            Symbol definedOrNotDefined = symbol();
            definedOrNotDefined.token = macros.contains(definedOrNotDefined)? PP_MOC_TRUE : PP_MOC_FALSE;
            substituted += definedOrNotDefined;
            if (braces)
                test(PP_RPAREN);
            continue;
        } else if (token == PP_NEWLINE) {
            substituted += symbol();
            break;
        } else {
            substituted += symbol();
        }
    }
}